

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageChannel.cpp
# Opt level: O0

void __thiscall Imf_3_2::ImageChannel::boundsCheck(ImageChannel *this,int x,int y)

{
  ImageLevel *this_00;
  ostream *poVar1;
  ArgExc *pAVar2;
  int in_EDX;
  int in_ESI;
  ImageChannel *in_RDI;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  Box2i *dataWindow;
  stringstream local_338 [16];
  ostream local_328 [392];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  Box2i *local_18;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  this_00 = level(in_RDI);
  local_18 = ImageLevel::dataWindow(this_00);
  if (((((local_18->min).x <= local_c) && (local_c <= (local_18->max).x)) &&
      ((local_18->min).y <= local_10)) && (local_10 <= (local_18->max).y)) {
    if ((local_c % in_RDI->_xSampling == 0) && (local_10 % in_RDI->_ySampling == 0)) {
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_338);
    poVar1 = std::operator<<(local_328,"Attempt to access a pixel at location (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    poVar1 = std::operator<<(poVar1,") in a channel whose x and y sampling rates are ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->_xSampling);
    poVar1 = std::operator<<(poVar1," and ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->_ySampling);
    std::operator<<(poVar1,".  The pixel coordinates are not divisible by the sampling rates.");
    pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar2,local_338);
    __cxa_throw(pAVar2,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Attempt to access a pixel at location (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1,") in an image whose data window is (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(local_18->min).x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(local_18->min).y);
  poVar1 = std::operator<<(poVar1,") - (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(local_18->max).x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(local_18->max).y);
  std::operator<<(poVar1,").");
  pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar2,local_1a0);
  __cxa_throw(pAVar2,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
ImageChannel::boundsCheck (int x, int y) const
{
    const Box2i& dataWindow = level ().dataWindow ();

    if (x < dataWindow.min.x || x > dataWindow.max.x || y < dataWindow.min.y ||
        y > dataWindow.max.y)
    {
        THROW (
            ArgExc,
            "Attempt to access a pixel at location "
            "(" << x
                << ", " << y
                << ") in an image whose data window is "
                   "("
                << dataWindow.min.x << ", " << dataWindow.min.y
                << ") - "
                   "("
                << dataWindow.max.x << ", " << dataWindow.max.y << ").");
    }

    if (x % _xSampling || y % _ySampling)
    {
        THROW (
            ArgExc,
            "Attempt to access a pixel at location "
            "(" << x
                << ", " << y
                << ") in a channel whose x and y sampling "
                   "rates are "
                << _xSampling << " and " << _ySampling
                << ".  The "
                   "pixel coordinates are not divisible by the sampling rates.");
    }
}